

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

void __thiscall pm::Camera::computeUvw(Camera *this)

{
  Vector3 local_34;
  Vector3 local_28;
  Vector3 local_1c;
  Camera *local_10;
  Camera *this_local;
  
  local_10 = this;
  Vector3::operator-(&local_1c,&this->eye_);
  Vector3::operator=(&this->w_,&local_1c);
  Vector3::normalize(&this->w_);
  cross((pm *)&local_28,&this->up_,&this->w_);
  Vector3::operator=(&this->u_,&local_28);
  Vector3::normalize(&this->u_);
  cross((pm *)&local_34,&this->w_,&this->u_);
  Vector3::operator=(&this->v_,&local_34);
  return;
}

Assistant:

void Camera::computeUvw()
{
	w_ = eye_ - lookAt_;
	w_.normalize();
	u_ = cross(up_, w_);
	u_.normalize();
	v_ = cross(w_, u_);

#if 0
	// take care of the singularity by hardwiring in specific camera orientations
	if (eye_.x == lookAt_.x && eye_.z == lookAt_.z && eye_.y > lookAt_.y)
	{
		// camera looking vertically down
		u_ = Vector3(0.0f, 0.0f, 1.0f);
		v_ = Vector3(1.0f, 0.0f, 0.0f);
		w_ = Vector3(0.0f, 1.0f, 0.0f);
	}

	if (eye_.x == lookAt_.x && eye_.z == lookAt_.z && eye_.y < lookAt_.y)
	{
		// camera looking vertically up
		u_ = Vector3(1.0f, 0.0f, 0.0f);
		v_ = Vector3(0.0f, 0.0f, 1.0f);
		w_ = Vector3(0.0f, -1.0f, 0.0f);
	}
#endif
}